

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastMdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  MessageLite *pMVar8;
  ulong uVar9;
  string *psVar10;
  char *pcVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar13;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ParseContext *ptr_00;
  uint *puVar14;
  ulong unaff_R13;
  ParseContext *pPVar15;
  pair<const_char_*,_int> pVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 local_58 [32];
  TcParseTableBase *local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  local_58._16_8_ = (long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30);
  if ((local_58._16_8_ & 7) != 0) {
    AlignFail(local_58._16_8_);
  }
  uVar2 = *(ushort *)ptr;
  local_38 = MessageLite::GetTcParseTable
                       (*(MessageLite **)
                         ((long)&table->has_bits_offset +
                         ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  local_58._24_8_ = local_38 + 1;
  do {
    ptr_00 = (ParseContext *)local_58._16_8_;
    pMVar8 = AddMessage(local_38,(RepeatedPtrFieldBase *)local_58._16_8_);
    bVar1 = *(byte *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ + 2);
    aVar12.data._1_7_ = 0;
    aVar12.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      ptr_00 = (ParseContext *)(ulong)(uint)bVar1;
      pVar16 = ReadSizeFallback((char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).
                                                limit_end_ + 2),(uint)bVar1);
      aVar12.data = pVar16._8_8_ & 0xffffffff;
    }
    else {
      pVar16._8_8_ = extraout_RDX;
      pVar16.first = (char *)((long)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_ +
                             3);
    }
    uVar13 = pVar16._8_8_;
    pPVar15 = (ParseContext *)pVar16.first;
    if ((pPVar15 == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
      pPVar15 = (ParseContext *)0x0;
    }
    else {
      ptr_00 = ctx;
      EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_58,(char *)ctx,(int)pVar16.first);
      unaff_R13 = local_58._0_8_ & 0xffffffff;
      ctx->depth_ = ctx->depth_ + -1;
      uVar13 = extraout_RDX_00;
    }
    uVar5 = local_58._24_8_;
    auVar17._8_8_ = uVar13;
    auVar17._0_8_ = local_58._0_8_;
    if (pPVar15 == (ParseContext *)0x0) {
LAB_0014e9fd:
      ptr = (char *)0x0;
    }
    else {
      iVar4 = ctx->depth_;
      local_58._0_8_ = pPVar15;
      while( true ) {
        ptr_00 = (ParseContext *)local_58;
        bVar6 = EpsCopyInputStream::DoneWithCheck
                          (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_);
        auVar17._8_8_ = extraout_RDX_01;
        auVar17._0_8_ = local_58._0_8_;
        if (bVar6) break;
        uVar3 = *(ushort *)&((EpsCopyInputStream *)local_58._0_8_)->limit_end_;
        uVar7 = (uint)((TcParseTableBase *)(uVar5 + -0x38))->fast_idx_mask & (uint)uVar3;
        if ((uVar7 & 7) != 0) goto LAB_0014eb09;
        uVar9 = (ulong)(uVar7 & 0xfffffff8);
        aVar12.data = (ulong)uVar3 ^ *(ulong *)((uint8_t *)(uVar5 + 8) + uVar9 * 2);
        auVar17 = (**(code **)((uint16_t *)uVar5 + uVar9))
                            (pMVar8,local_58._0_8_,ctx,aVar12.data,
                             (TcParseTableBase *)(uVar5 + -0x38),0);
        ptr_00 = (ParseContext *)local_58._0_8_;
        if ((auVar17._0_8_ == (ParseContext *)0x0) ||
           (local_58._0_8_ = auVar17._0_8_, (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
        break;
      }
      local_58._0_8_ = auVar17._0_8_;
      ptr = (char *)local_58._0_8_;
      if ((((TcParseTableBase *)(uVar5 + -0x38))->field_0x9 & 1) != 0) {
        ptr_00 = (ParseContext *)local_58._0_8_;
        auVar18 = (undefined1  [16])
                  (*((TcParseTableBase *)(uVar5 + -0x38))->post_loop_handler)
                            (pMVar8,(char *)local_58._0_8_,ctx);
        auVar17._8_8_ = auVar18._8_8_;
        auVar17._0_8_ = local_58._0_8_;
        ptr = (char *)auVar18._0_8_;
      }
      local_58._0_8_ = auVar17._0_8_;
      if ((ParseContext *)ptr != (ParseContext *)0x0) {
        ptr_00 = (ParseContext *)(long)ctx->depth_;
        if (iVar4 == ctx->depth_) {
          psVar10 = (string *)0x0;
        }
        else {
          psVar10 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                              ((long)iVar4,(long)ptr_00,"old_depth == depth_");
          auVar17._8_8_ = extraout_RDX_02;
          auVar17._0_8_ = local_58._0_8_;
        }
        local_58._0_8_ = auVar17._0_8_;
        if (psVar10 != (string *)0x0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,1099,*(undefined8 *)(psVar10 + 8),*(undefined8 *)psVar10);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_58);
        }
      }
      ctx->depth_ = ctx->depth_ + 1;
      uVar7 = (ctx->super_EpsCopyInputStream).limit_ + (int)unaff_R13;
      (ctx->super_EpsCopyInputStream).limit_ = uVar7;
      if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) goto LAB_0014e9fd;
      aVar12._0_4_ = (int)uVar7 >> 0x1f & uVar7;
      aVar12.data._4_4_ = 0;
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)aVar12._0_4_;
    }
    local_58._0_8_ = auVar17._0_8_;
    if ((ParseContext *)ptr == (ParseContext *)0x0) {
      pcVar11 = Error(msg,(char *)ptr_00,auVar17._8_8_,(TcFieldData)aVar12,table,hasbits);
      return pcVar11;
    }
    if ((ParseContext *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar14 & 3) != 0) {
          AlignFail();
        }
        *puVar14 = *puVar14 | (uint)hasbits;
      }
      return (char *)(ParseContext *)ptr;
    }
    uVar3 = *(ushort *)&(((ParseContext *)ptr)->super_EpsCopyInputStream).limit_end_;
    if (uVar3 != uVar2) {
      uVar7 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar7 & 7) == 0) {
        uVar9 = (ulong)(uVar7 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                    (msg,ptr,ctx,
                                     (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),
                                     table,hasbits);
        return pcVar11;
      }
LAB_0014eb09:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}